

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceManager.cpp
# Opt level: O0

string_view __thiscall
slang::SourceManager::getMacroName(SourceManager *this,SourceLocation location)

{
  SourceLocation location_00;
  string_view sVar1;
  bool bVar2;
  vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
  *this_00;
  add_pointer_t<const_slang::SourceManager::ExpansionInfo> ptVar3;
  SourceLocation in_RSI;
  long in_RDI;
  SourceRange SVar4;
  add_pointer_t<const_slang::SourceManager::ExpansionInfo> info;
  BufferID buffer;
  shared_lock<std::shared_mutex> lock;
  mutex_type *in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  uint32_t in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  SourceLocation in_stack_ffffffffffffff60;
  SourceLocation in_stack_ffffffffffffff68;
  SourceLocation in_stack_ffffffffffffff70;
  undefined7 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7f;
  BufferID local_6c;
  SourceLocation local_68;
  SourceRange local_60;
  SourceLocation local_50;
  SourceLocation local_38;
  SourceLocation local_18;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  local_18 = in_RSI;
  std::shared_lock<std::shared_mutex>::shared_lock
            ((shared_lock<std::shared_mutex> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),in_stack_ffffffffffffff48
            );
  SVar4.endLoc = in_stack_ffffffffffffff68;
  SVar4.startLoc = in_stack_ffffffffffffff70;
  while( true ) {
    local_38 = local_18;
    location_00._7_1_ = in_stack_ffffffffffffff7f;
    location_00._0_7_ = in_stack_ffffffffffffff78;
    in_stack_ffffffffffffff7f =
         isMacroArgLocImpl<std::shared_lock<std::shared_mutex>_>
                   ((SourceManager *)SVar4.startLoc,location_00,
                    (shared_lock<std::shared_mutex> *)SVar4.endLoc);
    if (!(bool)in_stack_ffffffffffffff7f) break;
    local_68 = local_18;
    SVar4 = getExpansionRangeImpl<std::shared_lock<std::shared_mutex>_>
                      ((SourceManager *)SVar4.endLoc,SVar4.startLoc,
                       (shared_lock<std::shared_mutex> *)in_stack_ffffffffffffff60);
    local_60 = SVar4;
    in_stack_ffffffffffffff60 = SourceRange::start(&local_60);
    local_50 = in_stack_ffffffffffffff60;
    local_18 = in_stack_ffffffffffffff60;
  }
  local_6c = SourceLocation::buffer
                       ((SourceLocation *)
                        CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  bVar2 = BufferID::operator_cast_to_bool((BufferID *)0x28f9a4);
  if (bVar2) {
    this_00 = (vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
               *)(in_RDI + 0x70);
    in_stack_ffffffffffffff54 = BufferID::getId(&local_6c);
    std::
    vector<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>,_std::allocator<std::variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>_>_>
    ::operator[](this_00,(ulong)in_stack_ffffffffffffff54);
    ptVar3 = std::
             get_if<slang::SourceManager::ExpansionInfo,slang::SourceManager::FileInfo,slang::SourceManager::ExpansionInfo>
                       ((variant<slang::SourceManager::FileInfo,_slang::SourceManager::ExpansionInfo>
                         *)0x28fa0a);
    if (ptVar3 == (add_pointer_t<const_slang::SourceManager::ExpansionInfo>)0x0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_10);
    }
    else {
      local_10._M_len = (ptVar3->macroName)._M_len;
      local_10._M_str = (ptVar3->macroName)._M_str;
    }
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_10);
  }
  std::shared_lock<std::shared_mutex>::~shared_lock
            ((shared_lock<std::shared_mutex> *)
             CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  sVar1._M_str = local_10._M_str;
  sVar1._M_len = local_10._M_len;
  return sVar1;
}

Assistant:

std::string_view SourceManager::getMacroName(SourceLocation location) const {
    std::shared_lock<std::shared_mutex> lock(mutex);
    while (isMacroArgLocImpl(location, lock))
        location = getExpansionRangeImpl(location, lock).start();

    auto buffer = location.buffer();
    if (!buffer)
        return {};

    SLANG_ASSERT(buffer.getId() < bufferEntries.size());
    auto info = std::get_if<ExpansionInfo>(&bufferEntries[buffer.getId()]);
    if (!info)
        return {};

    return info->macroName;
}